

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

int __thiscall pbrt::ParameterDictionary::remove(ParameterDictionary *this,char *__filename)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  ParsedParameter *pPVar2;
  size_t __n;
  int iVar3;
  undefined1 *puVar4;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar5;
  iterator ppPVar6;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *cpos;
  
  paVar1 = &(this->params).field_2;
  cpos = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
          *)(this->params).ptr;
  if (cpos == (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
               *)0x0) {
    cpos = paVar1;
  }
  puVar4 = (undefined1 *)((this->params).nStored << 3);
  if (puVar4 != (undefined1 *)0x0) {
    do {
      pPVar2 = cpos->fixed[0];
      __n = (pPVar2->name)._M_string_length;
      if ((__n == *(size_t *)(__filename + 8)) &&
         (((__n == 0 ||
           (iVar3 = bcmp((pPVar2->name)._M_dataplus._M_p,*(void **)__filename,__n), iVar3 == 0)) &&
          (iVar3 = std::__cxx11::string::compare((char *)pPVar2), iVar3 == 0)))) {
        ppPVar6 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                  ::erase(&this->params,cpos->fixed);
        return (int)ppPVar6;
      }
      cpos = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
              *)((long)cpos + 8);
      paVar5 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                *)(this->params).ptr;
      if (paVar5 == (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                     *)0x0) {
        paVar5 = paVar1;
      }
      puVar4 = (undefined1 *)((long)paVar5 + (this->params).nStored * 8);
    } while (cpos != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                      *)puVar4);
  }
  return (int)puVar4;
}

Assistant:

std::string ParameterDictionary::GetTexture(const std::string &name) const {
    for (const ParsedParameter *p : params) {
        if (p->name != name || p->type != "texture")
            continue;

        if (p->strings.empty())
            ErrorExit(&p->loc, "No string values provided for parameter \"%s\".", name);
        if (p->strings.size() > 1)
            ErrorExit(&p->loc, "More than one value provided for parameter \"%s\".",
                      name);
        p->lookedUp = true;
        return p->strings[0];
    }

    return "";
}